

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConeShape.cpp
# Opt level: O1

btVector3 __thiscall btConeShape::localGetSupportingVertex(btConeShape *this,btVector3 *vec)

{
  undefined1 auVar1 [16];
  btScalar abVar2 [4];
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  undefined1 auVar11 [12];
  float fVar3;
  undefined8 in_XMM1_Qa;
  undefined8 uVar12;
  undefined1 auVar4 [16];
  uint uVar5;
  float fVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  btVector3 bVar10;
  float local_28;
  float fStack_24;
  
  bVar10 = coneLocalSupport(this,vec);
  (*(this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
    _vptr_btCollisionShape[0xc])(this);
  if ((extraout_XMM0_Da != 0.0) || (NAN(extraout_XMM0_Da))) {
    fVar9 = vec->m_floats[2];
    fVar6 = vec->m_floats[0];
    fVar8 = vec->m_floats[1];
    fVar3 = fVar9 * fVar9 + fVar6 * fVar6 + fVar8 * fVar8;
    uVar7 = (uint)(fVar3 < 1.4210855e-14);
    uVar5 = (int)(uVar7 << 0x1f) >> 0x1f;
    uVar7 = (int)(uVar7 << 0x1f) >> 0x1f;
    fVar6 = (float)(uVar5 & 0xbf800000 | ~uVar5 & (uint)fVar6);
    fVar8 = (float)(uVar7 & 0xbf800000 | ~uVar7 & (uint)fVar8);
    if (fVar3 < 1.4210855e-14) {
      fVar9 = -1.0;
    }
    fVar3 = fVar9 * fVar9 + fVar6 * fVar6 + fVar8 * fVar8;
    if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
    }
    else {
      fVar3 = SQRT(fVar3);
    }
    fVar3 = 1.0 / fVar3;
    (*(this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
      _vptr_btCollisionShape[0xc])(this);
    local_28 = bVar10.m_floats[0];
    fStack_24 = bVar10.m_floats[1];
    abVar2[1] = fStack_24 + extraout_XMM0_Da_00 * fVar3 * fVar8;
    abVar2[0] = local_28 + extraout_XMM0_Da_00 * fVar3 * fVar6;
    auVar1._8_8_ = in_XMM1_Qa;
    auVar1._0_8_ = bVar10.m_floats._8_8_;
    auVar4._4_12_ = auVar1._4_12_;
    auVar4._0_4_ = bVar10.m_floats[2] + fVar3 * fVar9 * extraout_XMM0_Da_00;
    abVar2[2] = (btScalar)(int)auVar4._0_8_;
    abVar2[3] = (btScalar)(int)((ulong)auVar4._0_8_ >> 0x20);
    bVar10.m_floats = abVar2;
  }
  bVar10.m_floats[0] = bVar10.m_floats[0];
  auVar11._4_4_ = bVar10.m_floats[1];
  register0x00001240 = bVar10.m_floats[2];
  register0x00001244 = bVar10.m_floats[3];
  return (btVector3)bVar10.m_floats;
}

Assistant:

btVector3	btConeShape::localGetSupportingVertex(const btVector3& vec)  const
{
	btVector3 supVertex = coneLocalSupport(vec);
	if ( getMargin()!=btScalar(0.) )
	{
		btVector3 vecnorm = vec;
		if (vecnorm .length2() < (SIMD_EPSILON*SIMD_EPSILON))
		{
			vecnorm.setValue(btScalar(-1.),btScalar(-1.),btScalar(-1.));
		} 
		vecnorm.normalize();
		supVertex+= getMargin() * vecnorm;
	}
	return supVertex;
}